

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nxx.cpp
# Opt level: O0

bool mg::data::nxgx_compress(string_view *in,string *out)

{
  uLong uVar1;
  int iVar2;
  uint uVar3;
  uint32_t uVar4;
  size_type sVar5;
  long lVar6;
  Nxx *this;
  Nxx *header;
  int compressed_size;
  int err;
  int err_1;
  z_stream dstream;
  string *out_local;
  string_view *in_local;
  
  dstream.reserved = (uLong)out;
  memset(&err,0,0x70);
  sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(in);
  dstream.next_in._0_4_ = (undefined4)sVar5;
  _err = std::basic_string_view<char,_std::char_traits<char>_>::data(in);
  uVar1 = dstream.reserved;
  std::basic_string_view<char,_std::char_traits<char>_>::size(in);
  std::__cxx11::string::resize(uVar1);
  dstream.next_out._0_4_ = std::__cxx11::string::size();
  lVar6 = std::__cxx11::string::data();
  dstream.total_in = lVar6 + 0x10;
  dstream.avail_out = 0;
  dstream._36_4_ = 0;
  iVar2 = deflateInit2_(&err,0xffffffff,8,0x1f,8,0,"1.2.11",0x70);
  if ((iVar2 != 0) == 0) {
    uVar3 = deflate(&err,4);
    if ((uVar3 == 0) || (uVar3 == 1)) {
      uVar4 = dstream.avail_out;
      uVar3 = deflateEnd(&err);
      if ((uVar3 == 0) || (uVar3 == 1)) {
        this = (Nxx *)std::__cxx11::string::data();
        sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(in);
        this->size = (uint32_t)sVar5;
        this->compressed_size = uVar4;
        *(undefined4 *)this->magic = *(undefined4 *)MAGIC_NXGX;
        Nxx::to_file_order(this);
        std::__cxx11::string::resize(dstream.reserved);
        in_local._7_1_ = true;
      }
      else {
        fprintf(_stderr,"zlib deflateEnd error: %d: %s\n",(ulong)uVar3,dstream.total_out);
        in_local._7_1_ = false;
      }
    }
    else {
      fprintf(_stderr,"zlib deflate error: %d: %s\n",(ulong)uVar3,dstream.total_out);
      in_local._7_1_ = false;
    }
  }
  else {
    fprintf(_stderr,"zlib init error: %d: %s\n",(ulong)(uint)(iVar2 != 0),dstream.total_out);
    in_local._7_1_ = false;
  }
  return in_local._7_1_;
}

Assistant:

bool nxgx_compress(const std::string_view &in, std::string &out) {
  // Create stream context
  z_stream dstream{};
  dstream.avail_in = in.size();
  dstream.next_in =
      const_cast<uint8_t *>(reinterpret_cast<const uint8_t *>(in.data()));

  // Default output to same size as input + size of header
  out.resize(in.size() + sizeof(Nxx));

  // Set the output start to be past the end of the reserved header area
  dstream.avail_out = out.size();
  dstream.next_out = reinterpret_cast<uint8_t *>(out.data() + sizeof(Nxx));
  dstream.total_out = 0;

  // Init deflate context
  if (int err = deflateInit2(&dstream, -1, 8, 15 + 16, 8, 0) != Z_OK) {
    fprintf(stderr, "zlib init error: %d: %s\n", err, dstream.msg);
    return false;
  }

  // Perform deflate
  int err = deflate(&dstream, Z_FINISH);
  if (err != Z_OK && err != Z_STREAM_END) {
    fprintf(stderr, "zlib deflate error: %d: %s\n", err, dstream.msg);
    return false;
  }

  // Get the final compressed size
  const int compressed_size = dstream.total_out;

  err = deflateEnd(&dstream);
  if (err != Z_OK && err != Z_STREAM_END) {
    fprintf(stderr, "zlib deflateEnd error: %d: %s\n", err, dstream.msg);
    return false;
  }

  // Write the header
  Nxx *header = reinterpret_cast<Nxx *>(out.data());
  header->size = in.size();
  header->compressed_size = compressed_size;
  memcpy(header->magic, MAGIC_NXGX, sizeof(header->magic));
  header->to_file_order();

  // Shrunk output buffer to wrap
  out.resize(sizeof(Nxx) + compressed_size);

  return true;
}